

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printBDLAddrOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  uint RegNo;
  sysz_reg sVar2;
  MCOperand *pMVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  uint8_t *puVar7;
  uint64_t Length;
  uint64_t Disp;
  uint Base;
  SStream *O_local;
  int OpNum_local;
  MCInst *MI_local;
  
  pMVar3 = MCInst_getOperand(MI,OpNum);
  RegNo = MCOperand_getReg(pMVar3);
  pMVar3 = MCInst_getOperand(MI,OpNum + 1);
  uVar4 = MCOperand_getImm(pMVar3);
  pMVar3 = MCInst_getOperand(MI,OpNum + 2);
  uVar5 = MCOperand_getImm(pMVar3);
  if (uVar4 < 10) {
    SStream_concat(O,"%lu",uVar4);
  }
  else {
    SStream_concat(O,"0x%lx",uVar4);
  }
  if (uVar5 < 10) {
    SStream_concat(O,"(%lu",uVar5);
  }
  else {
    SStream_concat(O,"(0x%lx",uVar5);
  }
  if (RegNo != 0) {
    pcVar6 = getRegisterName(RegNo);
    SStream_concat(O,", %%%s",pcVar6);
  }
  SStream_concat0(O,")");
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar7 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x16;
    puVar7[0] = '\x03';
    puVar7[1] = '\0';
    puVar7[2] = '\0';
    puVar7[3] = '\0';
    sVar2 = SystemZ_map_register(RegNo);
    MI->flat_insn->detail->groups
    [(ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1e] = (uint8_t)sVar2;
    *(ulong *)(MI->flat_insn->detail->groups +
              (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x26) = uVar5;
    *(ulong *)(MI->flat_insn->detail->groups +
              (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x2e) = uVar4;
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printBDLAddrOperand(MCInst *MI, int OpNum, SStream *O)
{
	unsigned Base = MCOperand_getReg(MCInst_getOperand(MI, OpNum));
	uint64_t Disp = (uint64_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 1));
	uint64_t Length = (uint64_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 2));

	if (Disp > HEX_THRESHOLD)
		SStream_concat(O, "0x%"PRIx64, Disp);
	else
		SStream_concat(O, "%"PRIu64, Disp);

	if (Length > HEX_THRESHOLD)
		SStream_concat(O, "(0x%"PRIx64, Length);
	else
		SStream_concat(O, "(%"PRIu64, Length);

	if (Base)
		SStream_concat(O, ", %%%s", getRegisterName(Base));
	SStream_concat0(O, ")");

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_MEM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.base = (uint8_t)SystemZ_map_register(Base);
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.length = Length;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.disp = (int64_t)Disp;
		MI->flat_insn->detail->sysz.op_count++;
	}
}